

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

size_t ecpCreateJ_deep(size_t n,size_t f_deep)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t in_RSI;
  size_t in_RDI;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  
  lVar1 = in_RDI << 3;
  sVar2 = ecpToAJ_deep(in_RDI,in_RSI);
  sVar3 = ecpAddJ_deep(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sVar4 = ecpAddAJ_deep(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sVar5 = ecpSubJ_deep(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  sVar6 = ecpSubAJ_deep(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  sVar7 = ecpDblJ_deep(in_RDI,in_RSI);
  sVar8 = ecpDblJA3_deep(in_RDI,in_RSI);
  sVar9 = ecpDblAJ_deep(in_RDI,in_RSI);
  sVar10 = ecpTplJ_deep(in_RDI,in_RSI);
  sVar11 = ecpTplJA3_deep(in_RDI,in_RSI);
  sVar2 = utilMax(0xb,lVar1,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7,sVar8,sVar9,sVar10,sVar11);
  return sVar2;
}

Assistant:

size_t ecpCreateJ_deep(size_t n, size_t f_deep)
{
	return utilMax(11,
		O_OF_W(n),
		ecpToAJ_deep(n, f_deep),
		ecpAddJ_deep(n, f_deep),
		ecpAddAJ_deep(n, f_deep),
		ecpSubJ_deep(n, f_deep),
		ecpSubAJ_deep(n, f_deep),
		ecpDblJ_deep(n, f_deep),
		ecpDblJA3_deep(n, f_deep),
		ecpDblAJ_deep(n, f_deep),
		ecpTplJ_deep(n, f_deep),
		ecpTplJA3_deep(n, f_deep));
}